

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_asm.c
# Opt level: O0

void emit_asm_bytes(BuildCtx *ctx,uint8_t *p,int n)

{
  uint local_20;
  int i;
  int n_local;
  uint8_t *p_local;
  BuildCtx *ctx_local;
  
  for (local_20 = 0; (int)local_20 < n; local_20 = local_20 + 1) {
    if ((local_20 & 0xf) == 0) {
      fprintf((FILE *)ctx->fp,"\t.byte %d",(ulong)p[(int)local_20]);
    }
    else {
      fprintf((FILE *)ctx->fp,",%d",(ulong)p[(int)local_20]);
    }
    if ((local_20 & 0xf) == 0xf) {
      putc(10,(FILE *)ctx->fp);
    }
  }
  if ((n & 0xfU) != 0) {
    putc(10,(FILE *)ctx->fp);
  }
  return;
}

Assistant:

static void emit_asm_bytes(BuildCtx *ctx, uint8_t *p, int n)
{
  int i;
  for (i = 0; i < n; i++) {
    if ((i & 15) == 0)
      fprintf(ctx->fp, "\t.byte %d", p[i]);
    else
      fprintf(ctx->fp, ",%d", p[i]);
    if ((i & 15) == 15) putc('\n', ctx->fp);
  }
  if ((n & 15) != 0) putc('\n', ctx->fp);
}